

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

string * __thiscall
czh::token::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  VT local_58;
  Token *local_30;
  overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_token_hpp:159:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_token_hpp:160:15),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_caozhanhao[P]wxserver_thirdparty_libczh_include_libczh_token_hpp:161:15)>
  local_20;
  Token *local_18;
  Token *this_local;
  
  local_30 = this;
  local_20.super_anon_class_8_1_8991fb9c.this =
       (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)this;
  local_18 = this;
  this_local = (Token *)__return_storage_ptr__;
  czh::value::Value::get_variant_abi_cxx11_(&local_58,&this->what);
  std::
  visit<czh::utils::overloaded<czh::token::Token::to_string[abi:cxx11]()const::_lambda(auto:1&&)_1_,czh::token::Token::to_string[abi:cxx11]()const::_lambda(czh::value::Reference)_1_,czh::token::Token::to_string[abi:cxx11]()const::_lambda(int)_1_>,std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string,czh::value::Reference,std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>>>
            (__return_storage_ptr__,&local_20,&local_58);
  std::
  variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~variant(&local_58);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string to_string() const
    {
      return std::visit(
          utils::overloaded{
              [](auto &&i) -> auto { return czh::utils::to_czhstr(i); },
              [](value::Reference) -> auto { return std::string(); },
              [this](int i) -> auto
              {
                if (type == TokenType::VALUE) return czh::utils::to_czhstr(i);
                return std::string(1, static_cast<char>(i));
              }
          }, what.get_variant());
    }